

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskablock.c
# Opt level: O0

mkv_timestamp_t MATROSKA_BlockGetFrameEnd(matroska_block *Block,size_t FrameNum)

{
  mkv_timestamp_t mVar1;
  mkv_timestamp_t mVar2;
  mkv_timestamp_t a;
  mkv_timestamp_t Result;
  size_t FrameNum_local;
  matroska_block *Block_local;
  
  mVar1 = MATROSKA_BlockGetFrameStart(Block,FrameNum);
  if (mVar1 == 0x7fffffffffffffff) {
    Block_local = (matroska_block *)0x7fffffffffffffff;
  }
  else {
    mVar2 = MATROSKA_BlockGetFrameDuration(Block,FrameNum);
    if (mVar2 == 0x7fffffffffffffff) {
      Block_local = (matroska_block *)0x7fffffffffffffff;
    }
    else {
      Block_local = (matroska_block *)(mVar1 + mVar2);
    }
  }
  return (mkv_timestamp_t)Block_local;
}

Assistant:

mkv_timestamp_t MATROSKA_BlockGetFrameEnd(const matroska_block *Block, size_t FrameNum)
{
    mkv_timestamp_t Result = MATROSKA_BlockGetFrameStart(Block,FrameNum), a;
    if (Result==INVALID_TIMESTAMP_T)
        return INVALID_TIMESTAMP_T;
    a = MATROSKA_BlockGetFrameDuration(Block,FrameNum);
    if (a==INVALID_TIMESTAMP_T)
        return INVALID_TIMESTAMP_T;
    return Result + a;
}